

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O1

bool __thiscall
glcts::PipelineStatisticsQueryTestFunctional7::executeTest
          (PipelineStatisticsQueryTestFunctional7 *this,GLenum current_query_target)

{
  _draw_call_type *draw_call_type_ptr;
  Context *pCVar1;
  uint *puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  GLenum value;
  _primitive_type primitive_type;
  _draw_call_type draw_call;
  string local_288;
  uint *local_268;
  _primitive_type *local_260;
  uint index_data [8];
  _test_execution_result run_result;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [376];
  float vertex_data [16];
  Functions *gl;
  
  iVar5 = (*((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  run_result.result_qo_int = 0x7fffffff;
  run_result.result_qo_int64 = 0x7fffffffffffffff;
  run_result.result_qo_uint = 0xffffffff;
  run_result.result_qo_uint64 = 0xffffffffffffffff;
  run_result.result_int = 0x7fffffff;
  run_result.result_int64 = 0x7fffffffffffffff;
  run_result.result_uint = 0xffffffff;
  run_result.result_uint64 = 0xffffffffffffffff;
  run_result.int64_written = false;
  run_result.uint64_written = false;
  vertex_data[0xc] = -0.3;
  vertex_data[0xd] = -0.7;
  vertex_data[0xe] = 0.0;
  vertex_data[0xf] = 0.0;
  vertex_data[8] = -0.4;
  vertex_data[9] = 0.2;
  vertex_data[10] = 0.6;
  vertex_data[0xb] = -0.3;
  vertex_data[4] = 0.75;
  vertex_data[5] = -0.75;
  vertex_data[6] = 0.3;
  vertex_data[7] = 0.7;
  vertex_data[0] = 0.0;
  vertex_data[1] = 0.75;
  vertex_data[2] = -0.75;
  vertex_data[3] = -0.75;
  index_data[4] = 4;
  index_data[5] = 5;
  index_data[6] = 6;
  index_data[7] = 7;
  index_data[0] = 0;
  index_data[1] = 2;
  index_data[2] = 1;
  index_data[3] = 3;
  *(undefined1 **)
   &(this->super_PipelineStatisticsQueryTestFunctionalBase).
    m_indirect_draw_call_baseinstance_argument = &DAT_100000001;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument = 3;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_first_argument = 0;
  local_268 = &(this->super_PipelineStatisticsQueryTestFunctionalBase).
               m_indirect_draw_call_count_argument;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_primcount_argument =
       4;
  PipelineStatisticsQueryTestFunctionalBase::initFBO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase);
  PipelineStatisticsQueryTestFunctionalBase::initVBO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,vertex_data,0x40,index_data,0x20
             ,(this->super_PipelineStatisticsQueryTestFunctionalBase).
              m_indirect_draw_call_count_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_primcount_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_baseinstance_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_first_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_basevertex_argument);
  PipelineStatisticsQueryTestFunctionalBase::initVAO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,2);
  local_260 = &(this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_primitive_type;
  draw_call_type_ptr =
       &(this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_draw_call_type;
  primitive_type = PRIMITIVE_TYPE_FIRST;
  bVar4 = true;
  do {
    if (primitive_type != PRIMITIVE_TYPE_PATCHES) {
      (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_primitive_type =
           primitive_type;
      uVar6 = PipelineStatisticsQueryUtilities::getNumberOfVerticesForPrimitiveType(primitive_type);
      puVar2 = local_268;
      (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument =
           uVar6;
      (*gl->bufferSubData)
                (0x8892,(ulong)(this->super_PipelineStatisticsQueryTestFunctionalBase).
                               m_vbo_indirect_arrays_argument_offset,4,local_268);
      (*gl->bufferSubData)
                (0x8892,(ulong)(this->super_PipelineStatisticsQueryTestFunctionalBase).
                               m_vbo_indirect_elements_argument_offset,4,puVar2);
      GVar7 = (*gl->getError)();
      glu::checkError(GVar7,"glBufferSubData() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                      ,0x1031);
      draw_call = DRAW_CALL_TYPE_GLDRAWARRAYS;
      do {
        *draw_call_type_ptr = draw_call;
        bVar3 = PipelineStatisticsQueryUtilities::isDrawCallSupported(draw_call,gl);
        if (bVar3) {
          (*gl->clear)(0x4100);
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"glClear() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                          ,0x1041);
          pCVar1 = (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context;
          bVar3 = PipelineStatisticsQueryUtilities::executeQuery
                            (current_query_target,
                             (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id,
                             (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id,
                             PipelineStatisticsQueryTestFunctionalBase::queryCallbackDrawCallHandler
                             ,this,pCVar1->m_renderCtx,
                             (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                             super_TestCase.super_TestNode.m_testCtx,pCVar1->m_contextInfo,
                             &run_result);
          if (bVar3) {
            bVar3 = PipelineStatisticsQueryUtilities::verifyResultValues
                              (&run_result,1,&executeTest::expected_value,
                               (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id != 0,
                               current_query_target,draw_call_type_ptr,local_260,false,
                               (this->super_PipelineStatisticsQueryTestFunctionalBase).
                               super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                               VERIFICATION_TYPE_EQUAL_OR_GREATER);
            bVar4 = (bool)(bVar3 & bVar4);
          }
          else {
            local_1f8 = (undefined1  [8])
                        ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1f0,"Could not retrieve test run results for query target ["
                       ,0x36);
            PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
                      (&local_288,(PipelineStatisticsQueryUtilities *)(ulong)current_query_target,
                       value);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1f0,local_288._M_dataplus._M_p,local_288._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
            std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
            bVar4 = false;
          }
        }
        draw_call = draw_call + DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT;
      } while (draw_call != DRAW_CALL_TYPE_COUNT);
    }
    primitive_type = primitive_type + PRIMITIVE_TYPE_LINE_LOOP;
  } while (primitive_type != PRIMITIVE_TYPE_COUNT);
  return bVar4;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional7::executeTest(glw::GLenum current_query_target)
{
	const glw::Functions&									 gl		= m_context.getRenderContext().getFunctions();
	bool													 result = true;
	PipelineStatisticsQueryUtilities::_test_execution_result run_result;

	/* Sanity check: This method should only be called for GL_FRAGMENT_SHADER_INVOCATIONS_ARB query */
	DE_ASSERT(current_query_target == GL_FRAGMENT_SHADER_INVOCATIONS_ARB);

	/* Set up VBO. */
	const unsigned int n_vertex_components = 2;
	const float		   vertex_data[]	   = { 0.0f,  0.75f, -0.75f, -0.75f, 0.75f, -0.75f, 0.3f, 0.7f,
								  -0.4f, 0.2f,  0.6f,   -0.3f,  -0.3f, -0.7f,  0.0f, 0.0f };
	const unsigned int index_data[] = { 0, 2, 1, 3, 4, 5, 6, 7 };

	m_indirect_draw_call_baseinstance_argument = 1;
	m_indirect_draw_call_basevertex_argument   = 1;
	m_indirect_draw_call_count_argument =
		3; /* this value will be updated in the actual loop, so use anything for now */
	m_indirect_draw_call_first_argument		= 0;
	m_indirect_draw_call_primcount_argument = 4;

	initFBO();
	initVBO(vertex_data, sizeof(vertex_data), index_data, sizeof(index_data), m_indirect_draw_call_count_argument,
			m_indirect_draw_call_primcount_argument, m_indirect_draw_call_baseinstance_argument,
			m_indirect_draw_call_first_argument, m_indirect_draw_call_basevertex_argument);

	initVAO(n_vertex_components);

	/* Iterate over all primitive types */
	for (int current_primitive_type_it = static_cast<int>(PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_FIRST);
		 current_primitive_type_it < static_cast<int>(PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_COUNT);
		 ++current_primitive_type_it)
	{
		PipelineStatisticsQueryUtilities::_primitive_type current_primitive_type =
			static_cast<PipelineStatisticsQueryUtilities::_primitive_type>(current_primitive_type_it);
		/* Exclude 'patches' primitive type */
		if (current_primitive_type == PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES)
		{
			continue;
		}

		m_current_primitive_type = current_primitive_type;

		/* Update 'count' argument so that we only use as many vertices as needed for current
		 * primitive type.
		 */
		unsigned int count_argument_value =
			PipelineStatisticsQueryUtilities::getNumberOfVerticesForPrimitiveType(m_current_primitive_type);

		m_indirect_draw_call_count_argument = count_argument_value;

		gl.bufferSubData(GL_ARRAY_BUFFER, m_vbo_indirect_arrays_argument_offset, sizeof(unsigned int),
						 &m_indirect_draw_call_count_argument);
		gl.bufferSubData(GL_ARRAY_BUFFER, m_vbo_indirect_elements_argument_offset, sizeof(unsigned int),
						 &m_indirect_draw_call_count_argument);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call(s) failed.");

		/* Iterate through all draw call types */
		for (unsigned int n_draw_call_type = 0;
			 n_draw_call_type < PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_COUNT; ++n_draw_call_type)
		{
			m_current_draw_call_type = (PipelineStatisticsQueryUtilities::_draw_call_type)n_draw_call_type;

			/* Only continue if the draw call is supported by the context */
			if (!PipelineStatisticsQueryUtilities::isDrawCallSupported(m_current_draw_call_type, gl))
			{
				continue;
			}

			/* Clear the buffers before we proceed */
			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

			/* Execute the query */
			if (!PipelineStatisticsQueryUtilities::executeQuery(
					current_query_target, m_qo_id, m_bo_qo_id, queryCallbackDrawCallHandler,
					(PipelineStatisticsQueryTestFunctionalBase*)this, m_context.getRenderContext(), m_testCtx,
					m_context.getContextInfo(), &run_result))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Could not retrieve test run results for query target "
															   "["
								   << PipelineStatisticsQueryUtilities::getStringForEnum(current_query_target) << "]"
								   << tcu::TestLog::EndMessage;

				result = false;
			}
			else
			{
				static const glw::GLuint64 expected_value = 1; /* as per test spec */

				/* Compare it against query result values */
				result &= PipelineStatisticsQueryUtilities::verifyResultValues(
					run_result, 1, &expected_value, m_qo_id != 0, /* should_check_qo_bo_values */
					current_query_target, &m_current_draw_call_type, &m_current_primitive_type,
					false, /* is_primitive_restart_enabled */
					m_testCtx, PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EQUAL_OR_GREATER);

			} /* if (run results were obtained successfully) */
		}	 /* for (all draw call types) */
	}		  /* for (all primitive types) */

	return result;
}